

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_motion_facade.c
# Opt level: O0

void update_valid_ref_frames_for_gm
               (AV1_COMP *cpi,YV12_BUFFER_CONFIG **ref_buf,FrameDistPair (*reference_frames) [7],
               int *num_ref_frames)

{
  byte bVar1;
  uint uVar2;
  undefined1 uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int *piVar7;
  RefCntBuffer *ref_display_order_hint;
  int *in_RCX;
  long in_RDX;
  long in_RSI;
  AV1_COMP *in_RDI;
  int relative_frame_dist;
  int ref_pyr_lvl;
  int prune_ref_frames;
  int ref_disabled;
  RefCntBuffer *buf;
  MV_REFERENCE_FRAME ref_frame [2];
  int frame;
  int pyr_lvl;
  int cur_frame_gm_disabled;
  int ref_pruning_enabled;
  GF_GROUP *gf_group;
  int *num_future_ref_frames;
  int *num_past_ref_frames;
  AV1_COMMON *cm;
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  int in_stack_ffffffffffffff90;
  uint in_stack_ffffffffffffff94;
  undefined6 in_stack_ffffffffffffffa8;
  undefined1 uVar8;
  int frame_00;
  uint uVar9;
  int iVar10;
  
  piVar7 = in_RCX + 1;
  iVar4 = is_frame_eligible_for_ref_pruning
                    ((GF_GROUP *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                     in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88,0);
  iVar10 = 0;
  uVar9 = ((in_RDI->common).cur_frame)->pyramid_level;
  if ((in_RDI->sf).gm_sf.disable_gm_search_based_on_stats != 0) {
    iVar10 = disable_gm_search_based_on_stats(in_RDI);
  }
  for (frame_00 = 7; 0 < frame_00; frame_00 = frame_00 + -1) {
    uVar3 = (undefined1)frame_00;
    uVar8 = 0xff;
    ref_display_order_hint =
         get_ref_frame_buf((AV1_COMMON *)
                           CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                           (MV_REFERENCE_FRAME)((uint)in_stack_ffffffffffffff8c >> 0x18));
    uVar2 = in_RDI->ref_frame_flags;
    bVar1 = ""[frame_00];
    *(undefined8 *)(in_RSI + (long)frame_00 * 8) = 0;
    memcpy((in_RDI->common).global_motion + frame_00,&default_warp_params,0x24);
    if ((ref_display_order_hint != (RefCntBuffer *)0x0) &&
       (((uVar2 & bVar1) != 0 || ((in_RDI->sf).hl_sf.recode_loop == '\0')))) {
      *(YV12_BUFFER_CONFIG **)(in_RSI + (long)frame_00 * 8) = &ref_display_order_hint->buf;
      iVar5 = 0;
      if (iVar4 != 0) {
        iVar5 = prune_ref_by_selective_ref_frame
                          ((AV1_COMP *)CONCAT44(iVar4,iVar10),(MACROBLOCK *)CONCAT44(uVar9,frame_00)
                           ,(MV_REFERENCE_FRAME *)
                            CONCAT17(uVar8,CONCAT16(uVar3,in_stack_ffffffffffffffa8)),
                           (uint *)ref_display_order_hint);
        iVar5 = (uint)(iVar5 != 0) << 0x18;
      }
      in_stack_ffffffffffffff94 = ref_display_order_hint->pyramid_level;
      in_stack_ffffffffffffff8c = iVar5;
      if ((((*(int *)(*(long *)(in_RSI + (long)frame_00 * 8) + 0x10) ==
             (in_RDI->source->field_2).field_0.y_crop_width) &&
           (*(int *)(*(long *)(in_RSI + (long)frame_00 * 8) + 0x18) ==
            (in_RDI->source->field_3).field_0.y_crop_height)) &&
          (iVar6 = do_gm_search_logic(&in_RDI->sf,frame_00), iVar6 != 0)) &&
         (((iVar5 == 0 && ((int)in_stack_ffffffffffffff94 <= (int)uVar9)) &&
          ((iVar10 == 0 &&
           (in_stack_ffffffffffffff90 =
                 av1_encoder_get_relative_dist
                           (ref_display_order_hint->display_order_hint,
                            ((in_RDI->common).cur_frame)->display_order_hint),
           in_stack_ffffffffffffff90 != 0)))))) {
        if (in_stack_ffffffffffffff90 < 0) {
          iVar5 = in_stack_ffffffffffffff90;
          if (in_stack_ffffffffffffff90 < 1) {
            iVar5 = -in_stack_ffffffffffffff90;
          }
          *(int *)(in_RDX + (long)*in_RCX * 8) = iVar5;
          *(char *)(in_RDX + 4 + (long)*in_RCX * 8) = (char)frame_00;
          *in_RCX = *in_RCX + 1;
        }
        else {
          iVar5 = in_stack_ffffffffffffff90;
          if (in_stack_ffffffffffffff90 < 1) {
            iVar5 = -in_stack_ffffffffffffff90;
          }
          *(int *)(in_RDX + 0x38 + (long)*piVar7 * 8) = iVar5;
          *(char *)(in_RDX + 0x3c + (long)*piVar7 * 8) = (char)frame_00;
          *piVar7 = *piVar7 + 1;
        }
      }
    }
  }
  return;
}

Assistant:

static inline void update_valid_ref_frames_for_gm(
    AV1_COMP *cpi, YV12_BUFFER_CONFIG *ref_buf[REF_FRAMES],
    FrameDistPair reference_frames[MAX_DIRECTIONS][REF_FRAMES - 1],
    int *num_ref_frames) {
  AV1_COMMON *const cm = &cpi->common;
  int *num_past_ref_frames = &num_ref_frames[0];
  int *num_future_ref_frames = &num_ref_frames[1];
  const GF_GROUP *gf_group = &cpi->ppi->gf_group;
  int ref_pruning_enabled = is_frame_eligible_for_ref_pruning(
      gf_group, cpi->sf.inter_sf.selective_ref_frame, 1, cpi->gf_frame_index);
  int cur_frame_gm_disabled = 0;
  int pyr_lvl = cm->cur_frame->pyramid_level;

  if (cpi->sf.gm_sf.disable_gm_search_based_on_stats) {
    cur_frame_gm_disabled = disable_gm_search_based_on_stats(cpi);
  }

  for (int frame = ALTREF_FRAME; frame >= LAST_FRAME; --frame) {
    const MV_REFERENCE_FRAME ref_frame[2] = { frame, NONE_FRAME };
    RefCntBuffer *buf = get_ref_frame_buf(cm, frame);
    const int ref_disabled =
        !(cpi->ref_frame_flags & av1_ref_frame_flag_list[frame]);
    ref_buf[frame] = NULL;
    cm->global_motion[frame] = default_warp_params;
    // Skip global motion estimation for invalid ref frames
    if (buf == NULL ||
        (ref_disabled && cpi->sf.hl_sf.recode_loop != DISALLOW_RECODE)) {
      continue;
    } else {
      ref_buf[frame] = &buf->buf;
    }

    int prune_ref_frames =
        ref_pruning_enabled &&
        prune_ref_by_selective_ref_frame(cpi, NULL, ref_frame,
                                         cm->cur_frame->ref_display_order_hint);
    int ref_pyr_lvl = buf->pyramid_level;

    if (ref_buf[frame]->y_crop_width == cpi->source->y_crop_width &&
        ref_buf[frame]->y_crop_height == cpi->source->y_crop_height &&
        do_gm_search_logic(&cpi->sf, frame) && !prune_ref_frames &&
        ref_pyr_lvl <= pyr_lvl && !cur_frame_gm_disabled) {
      assert(ref_buf[frame] != NULL);
      const int relative_frame_dist = av1_encoder_get_relative_dist(
          buf->display_order_hint, cm->cur_frame->display_order_hint);
      // Populate past and future ref frames.
      // reference_frames[0][] indicates past direction and
      // reference_frames[1][] indicates future direction.
      if (relative_frame_dist == 0) {
        // Skip global motion estimation for frames at the same nominal instant.
        // This will generally be either a "real" frame coded against a
        // temporal filtered version, or a higher spatial layer coded against
        // a lower spatial layer. In either case, the optimal motion model will
        // be IDENTITY, so we don't need to search explicitly.
      } else if (relative_frame_dist < 0) {
        reference_frames[0][*num_past_ref_frames].distance =
            abs(relative_frame_dist);
        reference_frames[0][*num_past_ref_frames].frame = frame;
        (*num_past_ref_frames)++;
      } else {
        reference_frames[1][*num_future_ref_frames].distance =
            abs(relative_frame_dist);
        reference_frames[1][*num_future_ref_frames].frame = frame;
        (*num_future_ref_frames)++;
      }
    }
  }
}